

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

SP __thiscall
pbrt::SingleLevelFlattener::getOrCreateEmittedShapeFrom(SingleLevelFlattener *this,SP *object)

{
  bool bVar1;
  __shared_ptr *this_00;
  iterator this_01;
  mapped_type *pmVar2;
  vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  element_type *in_RDI;
  SP SVar4;
  shared_ptr<pbrt::Shape> geom;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *__range2;
  SP ours;
  vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
  *in_stack_ffffffffffffff48;
  shared_ptr<pbrt::Object> *in_stack_ffffffffffffff50;
  value_type *__x;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
  in_stack_ffffffffffffff98;
  value_type local_48 [4];
  
  std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11808b
            );
  bVar1 = std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
          ::empty(in_RDX);
  if (bVar1) {
    std::shared_ptr<pbrt::Object>::shared_ptr((shared_ptr<pbrt::Object> *)0x1180a7);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    this_00 = (__shared_ptr *)
              std::
              map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
              ::operator[]((map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
                            *)in_stack_ffffffffffffff90,(key_type *)in_stack_ffffffffffffff88._M_pi)
    ;
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      std::
      map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
      ::operator[]((map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
                    *)in_stack_ffffffffffffff90,(key_type *)in_stack_ffffffffffffff88._M_pi);
      std::shared_ptr<pbrt::Object>::shared_ptr
                (in_stack_ffffffffffffff50,(shared_ptr<pbrt::Object> *)in_stack_ffffffffffffff48);
      _Var3._M_pi = extraout_RDX_00;
    }
    else {
      std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1180fc);
      __x = local_48;
      std::operator+((char *)in_stack_ffffffffffffff98._M_current,in_stack_ffffffffffffff90);
      std::make_shared<pbrt::Object,std::__cxx11::string>(in_RSI);
      std::__cxx11::string::~string((string *)local_48);
      std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x118141);
      std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
      begin(in_stack_ffffffffffffff48);
      this_01 = std::
                vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                ::end(in_stack_ffffffffffffff48);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                            *)in_stack_ffffffffffffff50,
                           (__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                            *)in_stack_ffffffffffffff48);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
        ::operator*((__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                     *)&stack0xffffffffffffff98);
        in_stack_ffffffffffffff50 = (shared_ptr<pbrt::Object> *)&stack0xffffffffffffff80;
        std::shared_ptr<pbrt::Shape>::shared_ptr
                  ((shared_ptr<pbrt::Shape> *)in_stack_ffffffffffffff50,
                   (shared_ptr<pbrt::Shape> *)in_stack_ffffffffffffff48);
        std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1181a9);
        std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
        push_back(in_RDX,__x);
        std::shared_ptr<pbrt::Shape>::~shared_ptr((shared_ptr<pbrt::Shape> *)0x1181c6);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
        ::operator++((__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                      *)&stack0xffffffffffffff98);
      }
      pmVar2 = std::
               map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
               ::operator[]((map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
                             *)this_01._M_current,(key_type *)in_stack_ffffffffffffff88._M_pi);
      std::shared_ptr<pbrt::Object>::operator=(in_stack_ffffffffffffff50,pmVar2);
      std::shared_ptr<pbrt::Object>::shared_ptr(in_stack_ffffffffffffff50,pmVar2);
      std::shared_ptr<pbrt::Object>::~shared_ptr((shared_ptr<pbrt::Object> *)0x11824d);
      _Var3._M_pi = extraout_RDX_01;
    }
  }
  SVar4.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  SVar4.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar4.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Object::SP
    getOrCreateEmittedShapeFrom(Object::SP object)
    {
      if (object->shapes.empty()) return Object::SP();
      if (alreadyEmitted[object]) return alreadyEmitted[object];
      
      Object::SP ours = std::make_shared<Object>("ShapeFrom:"+object->name);
      for (auto geom : object->shapes)
        ours->shapes.push_back(geom);
      // light sources in instantiated objects aren't handled yet ...
      // for (auto lightSource : object->lightSources)
      //   ours->lightSources.push_back(lightSource);

      return alreadyEmitted[object] = ours;
    }